

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmGen7TextureCalc::FillTex2D
          (GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  GMM_RESOURCE_TYPE GVar5;
  anon_struct_8_45_9b07292e_for_Gpu aVar6;
  __GMM_BUFFER_TYPE *pBufferType;
  GMM_PLATFORM_INFO *pGVar7;
  GmmTextureCalc *this_00;
  uint8_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  int iVar11;
  GMM_STATUS GVar12;
  uint uVar13;
  uint32_t NumSamples;
  uint32_t uVar14;
  uint uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint32_t local_80;
  uint32_t local_7c;
  uint32_t CompressDepth;
  uint32_t RowFactor;
  uint local_70;
  uint local_6c;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  uint32_t ColFactor;
  uint32_t local_58;
  uint uStack_54;
  undefined8 uStack_50;
  GmmTextureCalc *local_40;
  uint local_38;
  uint8_t local_31;
  
  GVar12 = GMM_ERROR;
  if (pRestrictions != (__GMM_BUFFER_TYPE *)0x0 && pTexInfo != (GMM_TEXTURE_INFO *)0x0) {
    _ColFactor = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
    GVar5 = pTexInfo->Type;
    CompressWidth = pTexInfo->BitsPerPixel;
    uVar10 = pTexInfo->BaseHeight;
    local_38 = (uint)pTexInfo->BaseWidth;
    uVar14 = (pTexInfo->MSAA).NumSamples;
    uVar14 = uVar14 + (uVar14 == 0);
    (pTexInfo->MSAA).NumSamples = uVar14;
    uVar16 = pTexInfo->ArraySize;
    aVar6 = (pTexInfo->Flags).Gpu;
    uVar9 = 1;
    if (((ulong)aVar6 & 0x20000040) == 0) {
      uVar9 = uVar14;
    }
    uVar13 = uVar9 * ((uint)(GVar5 == RESOURCE_CUBE) * 5 + 1) * (uVar16 + (uVar16 == 0));
    uVar15 = uVar13;
    if ((((ulong)aVar6 & 0x18) != 0) &&
       (((uVar13 != uVar16 || 2 < uVar13 ||
         ((3 < pTexInfo->Format - GMM_FORMAT_B8G8R8A8_UNORM &&
          (1 < pTexInfo->Format - GMM_FORMAT_R8G8B8A8_UNORM)))) ||
        ((uVar15 = 4, ((byte)(((ulong)aVar6 & 0xffffffff) >> 3) & 0x1f & (local_38 & 0xf) == 0) == 0
         && ((((ulong)aVar6 & 0x10) == 0 || (local_38 % 0xc != 0)))))))) {
      (pTexInfo->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar6 & 0xffffffffffffffe7)
      ;
      uVar15 = uVar13;
    }
    _local_58 = CONCAT44(uStack_54,(pTexInfo->Alignment).HAlign);
    uVar14 = (pTexInfo->Alignment).VAlign;
    _CompressDepth = pRestrictions;
    GmmTextureCalc::GetCompressionBlockDimensions
              (&this->super_GmmTextureCalc,pTexInfo->Format,&local_6c,&local_70,&local_80);
    local_31 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
    local_40 = &this->super_GmmTextureCalc;
    if (uVar15 < 2) {
      uVar15 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[6])(this,pTexInfo);
    }
    else {
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
        uVar9 = 1;
      }
      else {
        uVar9 = (pTexInfo->MSAA).NumSamples;
      }
      uVar9 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,uVar10,uVar14,uVar9);
      if ((pTexInfo->MaxLod == 0) && (((ulong)(pTexInfo->Flags).Gpu & 0x20000440) == 0)) {
        (pTexInfo->Alignment).ArraySpacingSingleLod = '\x01';
      }
      else {
        if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
          NumSamples = 1;
        }
        else {
          NumSamples = (pTexInfo->MSAA).NumSamples;
        }
        uVar10 = GmmTextureCalc::ExpandHeight(local_40,uVar10 >> 1,uVar14,NumSamples);
        uVar9 = uVar9 + uVar14 * 0xc + uVar10;
      }
      if (local_31 == '\0') {
        local_70 = uVar9 >> ((byte)((uint)*(undefined4 *)&(pTexInfo->Flags).Gpu >> 0x1d) & 1);
      }
      else {
        local_70 = uVar9 / local_70;
      }
      uVar15 = local_70 * uVar15;
    }
    uVar16 = local_38;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
      uVar10 = 1;
    }
    else {
      uVar10 = (pTexInfo->MSAA).NumSamples;
    }
    uVar10 = GmmTextureCalc::ExpandWidth(local_40,local_38,local_58,uVar10);
    uVar13 = uVar10;
    if (1 < pTexInfo->MaxLod) {
      uVar9 = 1;
      uVar14 = 1;
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
        uVar14 = (pTexInfo->MSAA).NumSamples;
      }
      uVar14 = GmmTextureCalc::ExpandWidth(local_40,uVar16 >> 1,local_58,uVar14);
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
        uVar9 = (pTexInfo->MSAA).NumSamples;
      }
      uVar9 = GmmTextureCalc::ExpandWidth(local_40,local_38 >> 2,local_58,uVar9);
      uVar13 = uVar9 + uVar14;
      if (uVar9 + uVar14 < uVar10) {
        uVar13 = uVar10;
      }
    }
    this_00 = local_40;
    pGVar7 = _ColFactor;
    pBufferType = _CompressDepth;
    if (local_31 == '\0') {
      aVar6 = (pTexInfo->Flags).Gpu;
      if ((aVar6._0_4_ >> 0x1d & 1) == 0) {
        if (((ulong)aVar6 & 8) == 0) {
          if (((ulong)aVar6 & 0x10) != 0) {
            uVar13 = (uVar13 * pTexInfo->ArraySize) / 3;
          }
        }
        else {
          uVar13 = uVar13 * pTexInfo->ArraySize >> 2;
        }
      }
      else {
        uVar13 = uVar13 * 2;
      }
    }
    else {
      uVar13 = uVar13 / local_6c;
    }
    uVar16 = uVar13 * CompressWidth >> 3;
    if (uVar16 <= _CompressDepth->MinPitch) {
      uVar16 = _CompressDepth->MinPitch;
    }
    local_58 = -_CompressDepth->PitchAlignment & (_CompressDepth->PitchAlignment - 1) + uVar16;
    if (_ColFactor->TileInfo[pTexInfo->TileMode].LogicalSize == 0) {
      uStack_50 = 0;
      uStack_54 = uVar15;
    }
    else {
      uVar1 = _ColFactor->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
      uVar3 = _ColFactor->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
      local_58 = -uVar1 & local_58 + uVar1 + -1;
      uStack_54 = -uVar3 & uVar15 + uVar3 + -1;
      uStack_50 = 0;
      if (((((pTexInfo->Flags).Gpu.field_0x4 & 8) != 0) ||
          (((pTexInfo->Flags).Info.field_0x3 & 8) != 0)) &&
         (((pTexInfo->Flags).Info.field_0x4 & 0x10) != 0)) {
        CompressHeight = 0;
        local_7c = 0;
        GmmTextureCalc::GmmGetD3DToHwTileConversion(local_40,pTexInfo,&CompressHeight,&local_7c);
        auVar17._4_4_ = local_7c;
        auVar17._0_4_ = CompressHeight;
        auVar17._8_8_ = 0;
        uVar2 = pGVar7->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
        uVar4 = pGVar7->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        auVar18._4_4_ = uVar4;
        auVar18._0_4_ = uVar2;
        auVar18._8_8_ = 0;
        auVar17 = pmulld(auVar17,auVar18);
        local_58 = local_58 + auVar17._0_4_ + -1 & -auVar17._0_4_;
        uStack_50 = CONCAT44(uStack_50._4_4_ + auVar17._12_4_ + -1 & -auVar17._12_4_,
                             (int)uStack_50 + auVar17._8_4_ + -1 & -auVar17._8_4_);
        uStack_54 = uStack_54 + auVar17._4_4_ + -1 & -auVar17._4_4_;
      }
    }
    (pTexInfo->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)
         ((ulong)(pTexInfo->Flags).Info & 0xfffffffffffd7fff | 0x8000);
    uVar8 = GmmIsYUVPacked(pTexInfo->Format);
    if (((uVar8 != '\0') || (pTexInfo->BitsPerPixel == 0x60)) ||
       (uVar16 = uStack_54, pTexInfo->BitsPerPixel == 0x30)) {
      if (local_58 == 0) {
        iVar11 = 0x11;
      }
      else {
        iVar11 = (local_58 + 0xf) / local_58 + 1;
      }
      uVar16 = uStack_54 + iVar11;
    }
    GVar12 = GmmTextureCalc::FillTexPitchAndSize
                       (this_00,pTexInfo,(ulong)local_58,uVar16 + 1 & 0xfffffffe,pBufferType);
    if (GVar12 == GMM_SUCCESS) {
      (*this_00->_vptr_GmmTextureCalc[7])(this_00,pTexInfo);
      (pTexInfo->Alignment).PackedMipStartLod = 0xf;
    }
  }
  return GVar12;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen7TextureCalc::FillTex2D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   Width, Height, BitsPerPixel;
    uint32_t   HAlign, VAlign;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;
    uint32_t   AlignedWidth, BlockHeight, ExpandedArraySize, Pitch;
    uint8_t    Compress = 0;
    GMM_STATUS Status;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);

    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    Height       = pTexInfo->BaseHeight;
    Width        = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    pTexInfo->MSAA.NumSamples = GFX_MAX(pTexInfo->MSAA.NumSamples, 1);

    ExpandedArraySize =
    GFX_MAX(pTexInfo->ArraySize, 1) *
    ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1) * // Cubemaps simply 6-element, 2D arrays.
    ((pTexInfo->Flags.Gpu.Depth || pTexInfo->Flags.Gpu.SeparateStencil) ?
     1 :
     pTexInfo->MSAA.NumSamples); // Gen7 MSAA (non-Depth/Stencil) RT samples stored as array planes.

    //
    // Check for color separation
    //
    if(pTexInfo->Flags.Gpu.ColorSeparation || pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        bool csRestrictionsMet = (((ExpandedArraySize <= 2) &&
                                   (ExpandedArraySize == pTexInfo->ArraySize) &&
                                   ((pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM_SRGB)) &&
                                   ((pTexInfo->Flags.Gpu.ColorSeparation && (Width % 16) == 0) ||
                                    (pTexInfo->Flags.Gpu.ColorSeparationRGBX && (Width % 12) == 0))));

        if(csRestrictionsMet)
        {
            ExpandedArraySize = GMM_COLOR_SEPARATION_ARRAY_SIZE;
        }
        else
        {
            pTexInfo->Flags.Gpu.ColorSeparation     = 0;
            pTexInfo->Flags.Gpu.ColorSeparationRGBX = 0;
        }
    }

    HAlign = pTexInfo->Alignment.HAlign;
    VAlign = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    Compress = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    /////////////////////////////////
    // Calculate Block Surface Height
    /////////////////////////////////

    // Adjust total height for arrayed 2D textures
    if(ExpandedArraySize > 1)
    {
        uint32_t Height0, Height1;

        Height0 = __GMM_EXPAND_HEIGHT(this, Height, VAlign, pTexInfo);

        // If not ARYSPC_LOD0-eligible...
        if((pTexInfo->MaxLod > 0) ||
           pTexInfo->Flags.Gpu.Depth || // Depth/HiZ/Stencil buffers not ARYSPC_LOD0-compatible.
           pTexInfo->Flags.Gpu.HiZ ||
           pTexInfo->Flags.Gpu.SeparateStencil)
        {
            Height1 = __GMM_EXPAND_HEIGHT(this, Height >> 1, VAlign, pTexInfo);

            // QPitch = (h0 + h1 + 12j) * pitch
            BlockHeight = Height0 + Height1 + 12 * VAlign;
        }
        else // SURFACE_STATE: Surface Array Spacing: ARYSPC_LOD0
        {
            // QPitch = h0 * pitch
            BlockHeight                               = Height0;
            pTexInfo->Alignment.ArraySpacingSingleLod = true;
        }

        if(Compress)
        {
            BlockHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            BlockHeight /= 2;
        }

        // Compute total array height
        BlockHeight *= ExpandedArraySize;
    }
    else
    {
        BlockHeight = Get2DMipMapHeight(pTexInfo);
    }


    ///////////////////////////////////
    // Calculate Pitch
    ///////////////////////////////////

    AlignedWidth = __GMM_EXPAND_WIDTH(this, Width, HAlign, pTexInfo);

    // Calculate special pitch case of small dimensions where LOD1 + LOD2 widths are greater
    // than LOD0.  e.g. dimensions 4x4 and MinPitch == 1
    if(pTexInfo->MaxLod >= 2)
    {
        uint32_t AlignedWidthLod1, AlignedWidthLod2;

        AlignedWidthLod1 = __GMM_EXPAND_WIDTH(this, Width >> 1, HAlign, pTexInfo);
        AlignedWidthLod2 = __GMM_EXPAND_WIDTH(this, Width >> 2, HAlign, pTexInfo);

        AlignedWidth = GFX_MAX(AlignedWidth, AlignedWidthLod1 + AlignedWidthLod2);
    }

    if(Compress)
    {
        AlignedWidth /= CompressWidth;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil)
    {
        AlignedWidth *= 2;
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparation)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_WIDTH_DIVISION;
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION;
    }

    // Default pitch
    Pitch = AlignedWidth * BitsPerPixel >> 3;

    // Make sure the pitch satisfy linear min pitch requirment
    Pitch = GFX_MAX(Pitch, pRestrictions->MinPitch);

    // Make sure pitch satisfy alignment restriction
    Pitch = GFX_ALIGN(Pitch, pRestrictions->PitchAlignment);


    ////////////////////
    // Adjust for Tiling
    ////////////////////
    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        Pitch       = GFX_ALIGN(Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
        BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);

        // If Tiled Resource or Undefined64KBSwizzle resource, align to 64KB tile size
        if((pTexInfo->Flags.Gpu.TiledResource || pTexInfo->Flags.Info.Undefined64KBSwizzle) &&
           (pTexInfo->Flags.Info.TiledY))
        {
            uint32_t ColFactor = 0, RowFactor = 0;
            uint32_t TRTileWidth = 0, TRTileHeight = 0;

            GmmGetD3DToHwTileConversion(pTexInfo, &ColFactor, &RowFactor);
            TRTileWidth  = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth * ColFactor;
            TRTileHeight = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight * RowFactor;

            Pitch       = GFX_ALIGN(Pitch, TRTileWidth);
            BlockHeight = GFX_ALIGN(BlockHeight, TRTileHeight);
        }
    }

    GMM_ASSERTDPF(pTexInfo->Flags.Info.LayoutBelow || !pTexInfo->Flags.Info.LayoutRight, "MIPLAYOUT_RIGHT not supported after Gen6!");
    pTexInfo->Flags.Info.LayoutBelow = 1;
    pTexInfo->Flags.Info.LayoutRight = 0;

    // If a texture is YUV packed, 96, or 48 bpp then one row plus 16 bytes of
    // padding needs to be added. Since this will create a none pitch aligned
    // surface the padding is aligned to the next row
    if(GmmIsYUVPacked(pTexInfo->Format) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(96)) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(48)))
    {
        BlockHeight += GMM_SCANLINES(1) + GFX_CEIL_DIV(GMM_BYTES(16), Pitch);
    }

    // Align height to even row to cover for HW over - fetch
    BlockHeight = GFX_ALIGN(BlockHeight, __GMM_EVEN_ROW);

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, Pitch, BlockHeight, pRestrictions)) == GMM_SUCCESS)
    {
        Fill2DTexOffsetAddress(pTexInfo);

        // Init to no-packed mips. It'll be initialized when app calls to get packed
        // mips. Calculate packed mips here if there's a chance apps won't call to
        // get packed mips.
        pTexInfo->Alignment.PackedMipStartLod = GMM_TILED_RESOURCE_NO_PACKED_MIPS;
    }

    GMM_DPF_EXIT;
    return (Status);
}